

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

string * __thiscall
cmFindLibraryCommand::FindNormalLibraryDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  pointer pcVar1;
  string *psVar2;
  string *psVar3;
  pointer pNVar4;
  bool bVar5;
  string *name;
  string *sp;
  string *path;
  Name *i;
  Name *name_00;
  bool bVar6;
  cmFindLibraryHelper helper;
  string local_1b8;
  cmFindLibraryHelper local_198;
  
  pcVar1 = (this->super_cmFindBase).FindCommandName._M_dataplus._M_p;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,
             pcVar1 + (this->super_cmFindBase).FindCommandName._M_string_length);
  cmFindLibraryHelper::cmFindLibraryHelper
            (&local_198,&local_1b8,(this->super_cmFindBase).super_cmFindCommon.Makefile,
             &this->super_cmFindBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  name = (this->super_cmFindBase).Names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (name != psVar2) {
    do {
      std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::
      _M_erase_at_end(&local_198.Names,
                      local_198.Names.
                      super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      cmFindLibraryHelper::AddName(&local_198,name);
      psVar3 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (path = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pNVar4 = local_198.Names.
                   super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          name_00 = local_198.Names.
                    super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
                    ._M_impl.super__Vector_impl_data._M_start, path != psVar3; path = path + 1) {
        while ((bVar6 = name_00 != pNVar4, bVar6 &&
               (bVar5 = cmFindLibraryHelper::CheckDirectoryForName(&local_198,path,name_00), !bVar5)
               )) {
          name_00 = name_00 + 1;
        }
        if (bVar6) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,local_198.BestPath._M_dataplus._M_p,
                     local_198.BestPath._M_dataplus._M_p + local_198.BestPath._M_string_length);
          if (bVar6) goto LAB_003654ba;
        }
      }
      name = name + 1;
    } while (name != psVar2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_003654ba:
  cmFindLibraryHelper::~cmFindLibraryHelper(&local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindNormalLibraryDirsPerName()
{
  // Search the entire path for each name.
  cmFindLibraryHelper helper(this->FindCommandName, this->Makefile, this);
  for (std::string const& n : this->Names) {
    // Switch to searching for this name.
    helper.SetName(n);

    // Search every directory.
    for (std::string const& sp : this->SearchPaths) {
      if (helper.CheckDirectory(sp)) {
        return helper.BestPath;
      }
    }
  }
  // Couldn't find the library.
  return "";
}